

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool __thiscall QApplication::event(QApplication *this,QEvent *e)

{
  char cVar1;
  ushort uVar2;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar3;
  QWidget **ppQVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  QWindow *pQVar8;
  QEvent *this_01;
  QWidget *pQVar9;
  iterator iVar10;
  iterator iVar11;
  QStyle *pQVar12;
  undefined8 uVar13;
  QObject *pQVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  QList<QWidget_*> local_68;
  undefined1 *puStack_50;
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(ushort *)(e + 8);
  if (uVar2 < 0x26) {
    if (uVar2 == 1) {
      lVar15 = *(long *)&this->field_0x8;
      if (*(int *)(e + 0x10) == *(int *)(lVar15 + 400)) {
        QBasicTimer::stop();
        if (((*(long *)(lVar15 + 0x1b0) != 0) && (*(int *)(*(long *)(lVar15 + 0x1b0) + 4) != 0)) &&
           (*(QWidget **)(lVar15 + 0x1b8) != (QWidget *)0x0)) {
          pQVar9 = QWidget::window(*(QWidget **)(lVar15 + 0x1b8));
          bVar5 = QWidget::testAttribute_helper(pQVar9,WA_AlwaysShowToolTips);
          if (!bVar5) {
            do {
              bVar5 = QWidget::isActiveWindow(pQVar9);
              pQVar9 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10);
              if (pQVar9 == (QWidget *)0x0) break;
              pQVar9 = QWidget::window(pQVar9);
            } while ((~bVar5 & pQVar9 != (QWidget *)0x0) != 0);
            if (!bVar5) goto LAB_002bbc32;
          }
          local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
          QHelpEvent::QHelpEvent
                    ((QHelpEvent *)&local_68,ToolTip,(QPoint *)(lVar15 + 0x198),
                     (QPoint *)(lVar15 + 0x1a0));
          if ((*(long *)(lVar15 + 0x1b0) == 0) || (*(int *)(*(long *)(lVar15 + 0x1b0) + 4) == 0)) {
            pQVar14 = (QObject *)0x0;
          }
          else {
            pQVar14 = *(QObject **)(lVar15 + 0x1b8);
          }
          QCoreApplication::sendEvent(pQVar14,(QEvent *)&local_68);
          if (local_68.d.ptr._4_1_ == '\x01') {
            pQVar12 = QWidget::style(*(QWidget **)(lVar15 + 0x1b8));
            if ((*(long *)(lVar15 + 0x1b0) == 0) || (*(int *)(*(long *)(lVar15 + 0x1b0) + 4) == 0))
            {
              uVar13 = 0;
            }
            else {
              uVar13 = *(undefined8 *)(lVar15 + 0x1b8);
            }
            iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,99,0,uVar13,0);
            QBasicTimer::start(lVar15 + 0x194,(long)iVar7 * 1000000,1,this);
          }
          QHelpEvent::~QHelpEvent((QHelpEvent *)&local_68);
        }
      }
      else if (*(int *)(e + 0x10) == *(int *)(lVar15 + 0x194)) {
        QBasicTimer::stop();
      }
    }
    else {
      if (uVar2 == 0x14) {
        closeAllWindows();
        topLevelWidgets();
        iVar10 = QList<QWidget_*>::begin(&local_68);
        iVar11 = QList<QWidget_*>::end(&local_68);
        for (; iVar10.i != iVar11.i; iVar10.i = iVar10.i + 1) {
          pQVar9 = *iVar10.i;
          pQVar3 = pQVar9->data;
          if ((((((pQVar3->field_0x11 & 2) == 0) && ((pQVar3->widget_attributes & 0x8000) != 0)) &&
               (cVar1 = (char)(pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                              super_QFlagsStorage<Qt::WindowType>.i, cVar1 != '\x11')) &&
              (cVar1 != '\t')) &&
             (((cVar1 != '\x03' || (*(long *)(*(long *)&pQVar9->field_0x8 + 0x10) == 0)) &&
              (bVar5 = QWidget::testAttribute_helper(pQVar9,WA_DontShowOnScreen), !bVar5)))) {
            e[0xc] = (QEvent)0x0;
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
              }
            }
            goto LAB_002bbb78;
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
          }
        }
        uVar6 = QCoreApplication::event((QEvent *)this);
        goto LAB_002bbc3d;
      }
      if (uVar2 == 0x24) goto LAB_002bbb7f;
    }
  }
  else {
    if (uVar2 < 0x59) {
      if (uVar2 == 0x26) goto LAB_002bbb7f;
      if (uVar2 != 0x58) goto LAB_002bbc32;
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      topLevelWidgets();
      ppQVar4 = local_68.d.ptr;
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        lVar15 = local_68.d.size << 3;
        lVar16 = 0;
        do {
          pQVar9 = *(QWidget **)((long)ppQVar4 + lVar16);
          if (((char)(pQVar9->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i != '\x11') &&
             (bVar5 = QWidget::testAttribute_helper(pQVar9,WA_SetLocale), !bVar5)) {
            this_00 = *(QWidgetPrivate **)&pQVar9->field_0x8;
            QLocale::QLocale(&local_40);
            QWidgetPrivate::setLocale_helper(this_00,&local_40,true);
            QLocale::~QLocale(&local_40);
          }
          lVar16 = lVar16 + 8;
        } while (lVar15 != lVar16);
      }
    }
    else {
      if (uVar2 != 0x59) {
        if (uVar2 == 0x7c) {
          QWhatsThis::enterWhatsThisMode();
LAB_002bbb78:
          uVar6 = 1;
          goto LAB_002bbc3d;
        }
        goto LAB_002bbc32;
      }
LAB_002bbb7f:
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      topLevelWidgets();
      ppQVar4 = local_68.d.ptr;
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        lVar15 = local_68.d.size << 3;
        lVar16 = 0;
        do {
          pQVar9 = *(QWidget **)((long)ppQVar4 + lVar16);
          pQVar8 = QWidget::windowHandle(pQVar9);
          if ((pQVar8 == (QWindow *)0x0) &&
             ((char)(pQVar9->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i != '\x11')) {
            this_01 = (QEvent *)operator_new(0x10);
            QEvent::QEvent(this_01,(uint)*(ushort *)(e + 8));
            QCoreApplication::postEvent(&pQVar9->super_QObject,this_01,0);
          }
          lVar16 = lVar16 + 8;
        } while (lVar15 != lVar16);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
LAB_002bbc32:
  uVar6 = QGuiApplication::event((QEvent *)this);
LAB_002bbc3d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplication::event(QEvent *e)
{
    Q_D(QApplication);
    switch (e->type()) {
    case QEvent::Quit:
        // FIXME: This logic first tries to close all windows, and then
        // checks whether it was successful, but the conditions used in
        // closeAllWindows() differ from the verification logic below.
        // We should build on the logic in tryCloseAllWidgetWindows().
        closeAllWindows();
        for (auto *w : topLevelWidgets()) {
            if (w->data->is_closing)
                continue;
            if (w->isVisible() && !(w->windowType() == Qt::Desktop) && !(w->windowType() == Qt::Popup) &&
                 (!(w->windowType() == Qt::Dialog) || !w->parentWidget()) && !w->testAttribute(Qt::WA_DontShowOnScreen)) {
                e->ignore();
                return true;
            }
        }
        // Explicitly call QCoreApplication instead of QGuiApplication so that
        // we don't let QGuiApplication close any windows we skipped earlier in
        // closeAllWindows(). FIXME: Unify all this close magic through closeAllWindows.
        return QCoreApplication::event(e);
#ifndef Q_OS_WIN
    case QEvent::LocaleChange: {
        // on Windows the event propagation is taken care by the
        // WM_SETTINGCHANGE event handler.
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!(w->windowType() == Qt::Desktop)) {
                if (!w->testAttribute(Qt::WA_SetLocale))
                    w->d_func()->setLocale_helper(QLocale(), true);
            }
        }
        break;
    }
#endif
    case QEvent::Timer: {
        QTimerEvent *te = static_cast<QTimerEvent*>(e);
        Q_ASSERT(te != nullptr);
        if (te->timerId() == d->toolTipWakeUp.timerId()) {
            d->toolTipWakeUp.stop();
            if (d->toolTipWidget) {
                QWidget *w = d->toolTipWidget->window();
                // show tooltip if WA_AlwaysShowToolTips is set, or if
                // any ancestor of d->toolTipWidget is the active
                // window
                bool showToolTip = w->testAttribute(Qt::WA_AlwaysShowToolTips);
                while (w && !showToolTip) {
                    showToolTip = w->isActiveWindow();
                    w = w->parentWidget();
                    w = w ? w->window() : nullptr;
                }
                if (showToolTip) {
                    QHelpEvent e(QEvent::ToolTip, d->toolTipPos, d->toolTipGlobalPos);
                    QCoreApplication::sendEvent(d->toolTipWidget, &e);
                    if (e.isAccepted()) {
                        QStyle *s = d->toolTipWidget->style();
                        int sleepDelay = s->styleHint(QStyle::SH_ToolTip_FallAsleepDelay, nullptr, d->toolTipWidget, nullptr);
                        d->toolTipFallAsleep.start(sleepDelay, this);
                    }
                }
            }
        } else if (te->timerId() == d->toolTipFallAsleep.timerId()) {
            d->toolTipFallAsleep.stop();
        }
        break;
    }
#if QT_CONFIG(whatsthis)
    case QEvent::EnterWhatsThisMode:
        QWhatsThis::enterWhatsThisMode();
        return true;
#endif
    case QEvent::LanguageChange:
    case QEvent::ApplicationFontChange:
    case QEvent::ApplicationPaletteChange: {
        // QGuiApplication::event does not account for the cases where
        // there is a top level widget without a window handle. So they
        // need to have the event posted here
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!w->windowHandle() && (w->windowType() != Qt::Desktop))
                postEvent(w, new QEvent(e->type()));
        }
        break;
    }
    default:
        break;
    }

    return QGuiApplication::event(e);
}